

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minisketch.cpp
# Opt level: O2

size_t minisketch_merge(minisketch *sketch,minisketch *other_sketch)

{
  long lVar1;
  size_t sVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Sketch::Check((Sketch *)sketch);
  Sketch::Check((Sketch *)other_sketch);
  if ((*(int *)(sketch + 0x14) == *(int *)(other_sketch + 0x14)) &&
     (*(int *)(sketch + 0x10) == *(int *)(other_sketch + 0x10))) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      sVar2 = (**(code **)(*(long *)sketch + 0x38))(sketch,other_sketch);
      return sVar2;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return 0;
  }
  __stack_chk_fail();
}

Assistant:

size_t minisketch_merge(minisketch* sketch, const minisketch* other_sketch) {
    Sketch* s1 = (Sketch*)sketch;
    const Sketch* s2 = (const Sketch*)other_sketch;
    s1->Check();
    s2->Check();
    if (s1->Bits() != s2->Bits()) return 0;
    if (s1->Implementation() != s2->Implementation()) return 0;
    return s1->Merge(s2);
}